

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::init
          (OutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  uint uVar4;
  OutputCountCase *pOVar5;
  undefined8 uVar6;
  int *piVar7;
  bool bVar8;
  ContextType ctxType;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *pNVar10;
  long *plVar11;
  OutputCountShader *this_00;
  ShaderProgramDeclaration *pSVar12;
  pointer pcVar13;
  ostream *poVar14;
  pointer piVar15;
  InternalError *this_01;
  TestLog *pTVar16;
  int *piVar17;
  ulong uVar18;
  int *piVar19;
  bool *pbVar20;
  EVP_PKEY_CTX *ctx_00;
  long lVar21;
  GLint maxComponents;
  GLint maxVertices;
  int testVertices;
  size_type __dnew;
  ContextType local_4bc;
  OutputCountCase *local_4b8;
  EVP_PKEY_CTX *local_4b0;
  string local_4a8;
  VertexAttribute local_488;
  VertexAttribute local_460;
  string local_438;
  FragmentSource local_418;
  string local_3f8;
  VertexSource local_3d8;
  long *local_3b8;
  undefined8 local_3b0;
  long local_3a8;
  undefined2 local_3a0;
  undefined1 local_39e;
  ShaderProgramDeclaration *local_398;
  undefined4 *local_390;
  undefined8 local_388;
  undefined4 local_380;
  undefined4 uStack_37c;
  FragmentOutput local_36c;
  string local_368;
  GeometrySource local_348;
  string local_328;
  string local_308;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [6];
  ios_base local_278 [8];
  ios_base local_270 [264];
  GeometryToFragmentVarying local_168;
  VertexToGeometryVarying local_160;
  ShaderProgramDeclaration local_158;
  GeometryShaderDeclaration local_48;
  
  piVar19 = (this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar17 = piVar19 + 1;
  if (piVar17 != piVar3 && piVar19 != piVar3) {
    do {
      piVar7 = piVar17;
      if (*piVar17 <= *piVar19) {
        piVar7 = piVar19;
      }
      piVar19 = piVar7;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  local_460.name._M_dataplus._M_p._0_4_ = *piVar19;
  local_488.name._M_dataplus._M_p = local_488.name._M_dataplus._M_p & 0xffffffff00000000;
  local_4a8._M_dataplus._M_p._0_4_ = 0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar8) &&
     (bVar8 = glu::ContextInfo::isExtensionSupported
                        (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                         m_contextInfo,"GL_EXT_geometry_shader"), !bVar8)) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0x9c0);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar9) + 0x868))(0x8de0,&local_488);
  iVar9 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar9) + 0x868))(0x8de1,&local_4a8);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_GEOMETRY_OUTPUT_VERTICES = ",0x22);
  std::ostream::operator<<(poVar1,(uint)local_488.name._M_dataplus._M_p);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = ",0x2a);
  std::ostream::operator<<(poVar1,(int)local_4a8._M_dataplus._M_p);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Components per vertex = ",0x18);
  std::ostream::operator<<(poVar1,8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  if ((int)local_460.name._M_dataplus._M_p == -1) {
    iVar9 = (int)local_4a8._M_dataplus._M_p + 7;
    if (-1 < (int)local_4a8._M_dataplus._M_p) {
      iVar9 = (int)local_4a8._M_dataplus._M_p;
    }
    uVar4 = iVar9 >> 3;
    if ((int)(uint)local_488.name._M_dataplus._M_p < iVar9 >> 3) {
      uVar4 = (uint)local_488.name._M_dataplus._M_p;
    }
    *(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar4 & 0xfffffffe;
    if ((uVar4 & 0xfffffffe) == 0) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      local_2e8._0_8_ = local_2e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2e8,"Pattern size is invalid.","");
      tcu::InternalError::InternalError(this_01,(string *)local_2e8);
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if ((int)(uint)local_488.name._M_dataplus._M_p < (int)local_460.name._M_dataplus._M_p) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)&local_158,(int *)&local_460);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
      local_2e8._0_8_ = *plVar11;
      pTVar16 = (TestLog *)(plVar11 + 2);
      if ((TestLog *)local_2e8._0_8_ == pTVar16) {
        local_2d8[0]._0_8_ = pTVar16->m_log;
        local_2d8[0]._8_8_ = plVar11[3];
        local_2e8._0_8_ = (TestLog *)(local_2e8 + 0x10);
      }
      else {
        local_2d8[0]._0_8_ = pTVar16->m_log;
      }
      local_2e8._8_8_ = plVar11[1];
      *plVar11 = (long)pTVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_2e8);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((int)local_4a8._M_dataplus._M_p < (int)local_460.name._M_dataplus._M_p * 8) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_3b8 = (long *)CONCAT44(local_3b8._4_4_,(int)local_460.name._M_dataplus._M_p << 3);
      de::toString<int>((string *)&local_158,(int *)&local_3b8);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_158);
      local_2e8._0_8_ = *plVar11;
      pTVar16 = (TestLog *)(plVar11 + 2);
      if ((TestLog *)local_2e8._0_8_ == pTVar16) {
        local_2d8[0]._0_8_ = pTVar16->m_log;
        local_2d8[0]._8_8_ = plVar11[3];
        local_2e8._0_8_ = (TestLog *)(local_2e8 + 0x10);
      }
      else {
        local_2d8[0]._0_8_ = pTVar16->m_log;
      }
      local_2e8._8_8_ = plVar11[1];
      *plVar11 = (long)pTVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_2e8);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering ",10);
  local_4b0 = (EVP_PKEY_CTX *)&this->m_spec;
  std::ostream::operator<<
            (poVar1,(int)((ulong)((long)(this->m_spec).pattern.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->m_spec).pattern.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:",0x45);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  local_4b8 = this;
  if (0 < (int)((ulong)((long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    poVar1 = (ostringstream *)(local_2e8 + 8);
    lVar21 = 0;
    do {
      local_2e8._0_8_ =
           ((local_4b8->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode
           .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Row ",4);
      std::ostream::operator<<(poVar1,(int)lVar21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
      std::ostream::operator<<(poVar1,*(int *)(*(long *)local_4b0 + lVar21 * 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," vertices.",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_270);
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)((ulong)((long)(local_4b8->m_spec).pattern.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(local_4b8->m_spec).pattern.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2));
  }
  pOVar5 = local_4b8;
  this_00 = (OutputCountShader *)operator_new(0x178);
  local_4bc.super_ApiType.m_bits =
       (ApiType)(*((pOVar5->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b462c0;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b462f8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b46310;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_158);
  local_3b8 = &local_3a8;
  local_3a8 = 0x697469736f705f61;
  local_3a0 = 0x6e6f;
  local_3b0 = 10;
  local_39e = 0;
  local_460.name._M_dataplus._M_p = (pointer)&local_460.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_460);
  local_460.type = GENERICVECTYPE_FLOAT;
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_158,&local_460);
  local_390 = &local_380;
  local_380 = 0x6f635f61;
  local_388 = 7;
  uStack_37c = 0x726f6c;
  local_488.name._M_dataplus._M_p = (pointer)&local_488.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_488);
  local_488.type = GENERICVECTYPE_FLOAT;
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_488);
  local_160.type = GENERICVECTYPE_FLOAT;
  local_160.flatshade = false;
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_160);
  local_168.type = GENERICVECTYPE_FLOAT;
  local_168.flatshade = false;
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_168);
  local_36c.type = GENERICVECTYPE_FLOAT;
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_36c);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_2e8._0_8_ = (TestLog *)0xc9;
  pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)local_2e8);
  uVar6 = local_2e8._0_8_;
  local_3f8.field_2._M_allocated_capacity = local_2e8._0_8_;
  local_3f8._M_dataplus._M_p = pcVar13;
  memcpy(pcVar13,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
         ,0xc9);
  local_3f8._M_string_length = uVar6;
  pcVar13[uVar6] = '\0';
  specializeShader(&local_308,&local_3f8,&local_4bc);
  local_3d8.source._M_dataplus._M_p = (pointer)&local_3d8.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_308._M_dataplus._M_p,
             local_308._M_dataplus._M_p + local_308._M_string_length);
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_3d8);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_2e8._0_8_ = (TestLog *)0x9c;
  pcVar13 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)local_2e8);
  uVar6 = local_2e8._0_8_;
  local_438.field_2._M_allocated_capacity = local_2e8._0_8_;
  local_438._M_dataplus._M_p = pcVar13;
  memcpy(pcVar13,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
         ,0x9c);
  local_438._M_string_length = uVar6;
  pcVar13[uVar6] = '\0';
  specializeShader(&local_328,&local_438,&local_4bc);
  local_418.source._M_dataplus._M_p = (pointer)&local_418.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_328._M_dataplus._M_p,
             local_328._M_dataplus._M_p + local_328._M_string_length);
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_418);
  piVar19 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar17 = piVar19 + 1;
  if (piVar17 != piVar3 && piVar19 != piVar3) {
    do {
      piVar7 = piVar17;
      if (*piVar17 <= *piVar19) {
        piVar7 = piVar19;
      }
      piVar19 = piVar7;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  local_48.numOutputVertices = (size_t)*piVar19;
  local_48.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_48.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  local_48.numInvocations = 1;
  local_398 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar12,&local_48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"${GLSL_EXT_GEOMETRY_SHADER}",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"layout(points) in;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"layout(triangle_strip, max_vertices = ",0x26);
  piVar19 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar17 = piVar19 + 1;
  if (piVar17 != piVar3 && piVar19 != piVar3) {
    do {
      piVar7 = piVar17;
      if (*piVar17 <= *piVar19) {
        piVar7 = piVar19;
      }
      piVar19 = piVar7;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,") out;",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,
             "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp float rowHeight = 2.0 / float("
             ,0x82);
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,");\n\tconst highp float colWidth = 2.0 / float(",0x2d);
  piVar19 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar17 = piVar19 + 1;
  if (piVar17 != piVar3 && piVar19 != piVar3) {
    do {
      piVar7 = piVar17;
      if (*piVar17 <= *piVar19) {
        piVar7 = piVar19;
      }
      piVar19 = piVar7;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,");\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"\thighp int emitCount = ",0x17);
  piVar15 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar18 = (long)(pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar15;
  if (0 < (int)(uVar18 >> 2) + -1) {
    lVar21 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,"(gl_PrimitiveIDIn == ",0x15);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_2e8,(int)lVar21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ? (",5);
      poVar14 = (ostream *)
                std::ostream::operator<<(poVar14,*(int *)(*(long *)local_4b0 + lVar21 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") : (",5);
      lVar21 = lVar21 + 1;
      piVar15 = (local_4b8->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar18 = (long)(local_4b8->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar15;
    } while (lVar21 < (long)(uVar18 * 0x40000000 + -0x100000000) >> 0x20);
  }
  poVar14 = (ostream *)
            std::ostream::operator<<
                      (local_2e8,
                       *(int *)((long)piVar15 + ((long)(uVar18 * 0x40000000 + -0x100000000) >> 0x1e)
                               ));
  pOVar5 = local_4b8;
  bVar8 = (long)(local_4b8->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_4b8->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 4;
  pbVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (bVar8) {
    pbVar20 = (bool *)0x983f86;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pbVar20,(ulong)bVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,
             "\tfor (highp int ndx = 0; ndx < emitCount / 2; ndx++)\n\t{\n\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, 0.0, 0.0, 0.0);\n\t\tv_frag_FragColor = v_geom_FragColor[0];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[0].gl_Position + vec4(float(ndx) * 2.0 * colWidth, rowHeight, 0.0, 0.0);\n\t\tv_frag_FragColor = v_geom_FragColor[0];\n\t\tEmitVertex();\n\t}\n}\n"
             ,0x16a);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_368,&local_4a8,&local_4bc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_4a8._M_dataplus._M_p._4_4_,(int)local_4a8._M_dataplus._M_p) !=
      &local_4a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_4a8._M_dataplus._M_p._4_4_,(int)local_4a8._M_dataplus._M_p),
                    local_4a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  std::ios_base::~ios_base(local_278);
  paVar2 = &local_348.source.field_2;
  local_348.source._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_368._M_dataplus._M_p,
             local_368._M_dataplus._M_p + local_368._M_string_length);
  pSVar12 = sglr::pdec::ShaderProgramDeclaration::operator<<(local_398,&local_348);
  sglr::ShaderProgram::ShaderProgram((ShaderProgram *)this_00,pSVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.source._M_dataplus._M_p != paVar2) {
    operator_delete(local_348.source._M_dataplus._M_p,
                    local_348.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.source._M_dataplus._M_p != &local_418.source.field_2) {
    operator_delete(local_418.source._M_dataplus._M_p,
                    local_418.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,(ulong)(local_438.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.source._M_dataplus._M_p != &local_3d8.source.field_2) {
    operator_delete(local_3d8.source._M_dataplus._M_p,
                    local_3d8.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.name._M_dataplus._M_p != &local_488.name.field_2) {
    operator_delete(local_488.name._M_dataplus._M_p,local_488.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT44(uStack_37c,local_380) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.name._M_dataplus._M_p != &local_460.name.field_2) {
    operator_delete(local_460.name._M_dataplus._M_p,local_460.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_158);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b462c0;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b462f8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b46310;
  piVar19 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (pOVar5->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 =
       (int)((ulong)((long)piVar3 - (long)piVar19) >> 2);
  piVar17 = piVar19 + 1;
  if (piVar17 != piVar3 && (long)piVar3 - (long)piVar19 != 0) {
    do {
      piVar7 = piVar17;
      if (*piVar17 <= *piVar19) {
        piVar7 = piVar19;
      }
      piVar19 = piVar7;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar3);
  }
  this_00->m_patternMaxEmitCount = *piVar19;
  ctx_00 = local_4b0;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this_00->m_spec).pattern,(vector<int,_std::allocator<int>_> *)local_4b0);
  pOVar5->m_program = this_00;
  iVar9 = GeometryShaderRenderTest::init(&pOVar5->super_GeometryShaderRenderTest,ctx_00);
  return iVar9;
}

Assistant:

void OutputCountCase::init (void)
{
	// Check requirements and adapt to them
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		const int	testVertices		= *std::max_element(m_spec.pattern.begin(), m_spec.pattern.end());
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		// check the extension before querying anything
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (testVertices == -1)
		{
			// "max vertices"-case
			DE_ASSERT((int)m_spec.pattern.size() == 1);
			m_spec.pattern[0] = de::min(maxVertices, maxComponents / componentsPerVertex);

			// make sure size is dividable by 2, as OutputShader requires
			m_spec.pattern[0] = m_spec.pattern[0] & ~0x00000001;

			if (m_spec.pattern[0] == 0)
				throw tcu::InternalError("Pattern size is invalid.");
		}
		else
		{
			// normal case
			if (testVertices > maxVertices)
				throw tcu::NotSupportedError(de::toString(testVertices) + " output vertices required.");
			if (testVertices * componentsPerVertex > maxComponents)
				throw tcu::NotSupportedError(de::toString(testVertices * componentsPerVertex) + " output components required.");
		}
	}

	// Log what the test tries to do

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << (int)m_spec.pattern.size() << " row(s).\nOne geometry shader invocation generates one row.\nRow sizes:" << tcu::TestLog::EndMessage;
	for (int ndx = 0; ndx < (int)m_spec.pattern.size(); ++ndx)
		m_testCtx.getLog() << tcu::TestLog::Message << "Row " << ndx << ": " << m_spec.pattern[ndx] << " vertices." << tcu::TestLog::EndMessage;

	// Gen shader
	DE_ASSERT(!m_program);
	m_program = new OutputCountShader(m_context.getRenderContext().getType(), m_spec);

	// Case init
	GeometryShaderRenderTest::init();
}